

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O2

void __thiscall
PreciseMeasurement_invalid_Test::PreciseMeasurement_invalid_Test
          (PreciseMeasurement_invalid_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001addb0;
  return;
}

Assistant:

TEST(PreciseMeasurement, invalid)
{
    precise_measurement iv1(1.2, precise::invalid);
    EXPECT_FALSE(is_valid(iv1));
    EXPECT_FALSE(isnormal(iv1));

    precise_measurement iv2(constants::invalid_conversion, precise::m);
    EXPECT_FALSE(is_valid(iv2));
    EXPECT_FALSE(isnormal(iv2));

    precise_measurement iv3(constants::infinity, precise::m);
    EXPECT_TRUE(is_valid(iv3));
    EXPECT_FALSE(isnormal(iv3));

    precise_measurement iv4(1e-311, precise::m);  // subnormal
    EXPECT_TRUE(is_valid(iv4));
    EXPECT_FALSE(isnormal(iv4));

    precise_measurement iv5(0.0, precise::m);
    EXPECT_TRUE(is_valid(iv5));
    EXPECT_TRUE(isnormal(iv5));
}